

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_regset.c
# Opt level: O1

void time_compare(int n,char **ps,char *s,char *end)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  char **pat;
  clock_t cVar5;
  clock_t cVar6;
  char *pcVar7;
  char *in_R8;
  ulong uVar8;
  OnigRegSet *pOVar9;
  int iVar10;
  double local_90;
  double local_80;
  double local_78;
  double local_70;
  OnigRegSet *local_68;
  int match_pos;
  ulong local_58;
  clock_t local_50;
  size_t local_48;
  char **local_40;
  double local_38;
  
  local_58 = (ulong)(uint)n;
  local_48 = local_58 * 8;
  local_40 = ps;
  pat = (char **)malloc(local_48);
  if (pat != (char **)0x0) {
    iVar10 = 0;
    iVar2 = (int)(100 / (ulong)(uint)n);
    if (n < 1) {
      local_80 = 0.0;
      local_78 = 0.0;
    }
    else {
      local_78 = 0.0;
      local_80 = 0.0;
      do {
        memcpy(pat,local_40,local_48);
        uVar8 = local_58;
        if (n != 1) {
          do {
            iVar3 = rand();
            iVar3 = iVar3 % (int)uVar8;
            pcVar7 = pat[uVar8 - 1];
            pat[uVar8 - 1] = pat[iVar3];
            pat[iVar3] = pcVar7;
            bVar1 = 2 < (long)uVar8;
            uVar8 = uVar8 - 1;
          } while (bVar1);
        }
        bVar1 = false;
        iVar3 = make_regset(0,n,pat,&local_68,(int)in_R8);
        if (iVar3 == 0) {
          cVar5 = clock();
          pOVar9 = local_68;
          iVar3 = iVar2;
          if ((uint)n < 0x65) {
            do {
              in_R8 = end;
              uVar4 = onig_regset_search(pOVar9,s,end,s,end,0,0,&match_pos);
              if ((int)uVar4 < 0) {
                pcVar7 = "FAIL onig_regset_search(POSITION_LEAD): %d\n";
                goto LAB_00102a51;
              }
              iVar3 = iVar3 + -1;
            } while (iVar3 != 0);
          }
          cVar6 = clock();
          local_50 = clock();
          pOVar9 = local_68;
          local_90 = (double)(cVar6 - cVar5) / 1000000.0;
          iVar3 = iVar2;
          if ((uint)n < 0x65) {
LAB_0010298b:
            in_R8 = end;
            uVar4 = onig_regset_search(pOVar9,s,end,s,end,1,0,&match_pos);
            if (-1 < (int)uVar4) goto code_r0x001029b9;
            pcVar7 = "FAIL onig_regset_search(REGEX_LEAD): %d\n";
LAB_00102a51:
            bVar1 = false;
            fprintf(_stderr,pcVar7,(ulong)uVar4);
            local_90 = local_70;
            goto LAB_001029e5;
          }
LAB_001029bd:
          cVar5 = clock();
          local_38 = (double)(cVar5 - local_50) / 1000000.0;
          bVar1 = true;
          pOVar9 = local_68;
LAB_001029e5:
          onig_regset_free(pOVar9);
          local_70 = local_90;
        }
        if (!bVar1) {
          free(pat);
          return;
        }
        local_80 = local_80 + local_70;
        local_78 = local_78 + local_38;
        iVar10 = iVar10 + 1;
      } while (iVar10 != n);
      local_80 = local_80 * 1000.0;
      local_78 = local_78 * 1000.0;
    }
    free(pat);
    fprintf(_stdout,"POS lead: %6.2lfmsec.  REG lead: %6.2lfmsec.\n",local_80,local_78);
  }
  return;
code_r0x001029b9:
  iVar3 = iVar3 + -1;
  if (iVar3 == 0) goto LAB_001029bd;
  goto LAB_0010298b;
}

Assistant:

static void
time_compare(int n, char* ps[], char* s, char* end)
{
  int r;
  int i;
  int repeat;
  double t_set, t_reg;
  double total_set, total_reg;
  char** cps;

  cps = (char** )malloc(sizeof(char*) * n);
  if (cps == 0) return ;

  repeat = 100 / n;
  total_set = total_reg = 0.0;
  for (i = 0; i < n; i++) {
    fisher_yates_shuffle(n, ps, cps);
    r = time_test(repeat, n, cps, s, end, &t_set, &t_reg);
    if (r != 0) {
      free(cps);
      return ;
    }
    total_set += t_set;
    total_reg += t_reg;
  }

  free(cps);

  fprintf(stdout, "POS lead: %6.2lfmsec.  REG lead: %6.2lfmsec.\n",
          total_set * 1000.0, total_reg * 1000.0);
}